

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::setStyle(QFont *this,Style style)

{
  QFontPrivate *pQVar1;
  uint in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((*(uint *)(in_RDI + 8) & 0x20) == 0) ||
     (pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711fe0),
     ((uint)(*(ulong *)&(pQVar1->request).field_0x60 >> 0x1c) & 3) != in_ESI)) {
    detach((QFont *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712010);
    *(ulong *)&(pQVar1->request).field_0x60 =
         *(ulong *)&(pQVar1->request).field_0x60 & 0xffffffffcfffffff | ((ulong)in_ESI & 3) << 0x1c;
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x20;
  }
  return;
}

Assistant:

void QFont::setStyle(Style style)
{
    if ((resolve_mask & QFont::StyleResolved) && d->request.style == style)
        return;

    detach();

    d->request.style = style;
    resolve_mask |= QFont::StyleResolved;
}